

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void PlayerLandedOnThing(AActor *mo,AActor *onmobj)

{
  double dVar1;
  player_t *ppVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  FSoundID local_18;
  FSoundID local_14;
  
  ppVar2 = mo->player;
  if (ppVar2 != (player_t *)0x0) {
    if (ppVar2->mo == (APlayerPawn *)mo) {
      ppVar2->deltaviewheight = (mo->Vel).Z * 0.125;
    }
    if ((ppVar2->cheats & 0x2000) == 0) {
      P_FallingDamage(mo);
      if ((mo->player->morphTics == 0) && (0 < mo->health)) {
        dVar1 = (mo->Vel).Z;
        dVar3 = (double)((ulong)mo->player->mo->GruntSpeed ^ (ulong)DAT_005d6f40);
        if (dVar1 < dVar3) {
          local_14.ID = S_FindSound("*grunt");
          S_Sound(mo,2,&local_14,1.0,1.0);
        }
        if (onmobj == (AActor *)0x0) {
          iVar5 = mo->floorterrain;
          if (iVar5 < 0) {
            iVar5 = sector_t::GetTerrain((sector_t_conflict *)mo->Sector,0);
          }
          if (Terrains.Array[iVar5].IsLiquid != false) {
            return;
          }
        }
        if ((dVar3 <= dVar1) || (bVar4 = S_AreSoundsEquivalent(mo,"*grunt","*land"), !bVar4)) {
          local_18.ID = S_FindSound("*land");
          S_Sound(mo,0,&local_18,1.0,1.0);
        }
      }
    }
  }
  return;
}

Assistant:

static void PlayerLandedOnThing (AActor *mo, AActor *onmobj)
{
	bool grunted;

	if (!mo->player)
		return;

	if (mo->player->mo == mo)
	{
		mo->player->deltaviewheight = mo->Vel.Z / 8.;
	}

	if (mo->player->cheats & CF_PREDICTING)
		return;

	P_FallingDamage (mo);

	// [RH] only make noise if alive
	if (!mo->player->morphTics && mo->health > 0)
	{
		grunted = false;
		// Why should this number vary by gravity?
		if (mo->health > 0 && mo->Vel.Z < -mo->player->mo->GruntSpeed)
		{
			S_Sound (mo, CHAN_VOICE, "*grunt", 1, ATTN_NORM);
			grunted = true;
		}
		if (onmobj != NULL || !Terrains[P_GetThingFloorType (mo)].IsLiquid)
		{
			if (!grunted || !S_AreSoundsEquivalent (mo, "*grunt", "*land"))
			{
				S_Sound (mo, CHAN_AUTO, "*land", 1, ATTN_NORM);
			}
		}
	}
//	mo->player->centering = true;
}